

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test::TestBody
          (InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  undefined8 this_00;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CommissionerAppMock *pCVar5;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_01;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_02;
  element_type *peVar6;
  MockSpec<bool_()> *this_03;
  TypedExpectation<bool_()> *pTVar7;
  MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> *this_04;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_05;
  element_type *this_06;
  string local_cb8;
  AssertHelper local_c98;
  Message local_c90;
  bool local_c81;
  undefined1 local_c80 [8];
  AssertionResult gtest_ar__1;
  allocator local_c21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  Expression local_be0;
  string local_bc8;
  AssertHelper local_ba8;
  Message local_ba0;
  Value local_b98;
  bool local_b49;
  undefined1 local_b48 [8];
  AssertionResult gtest_ar_;
  string local_b30;
  Expression local_b10;
  undefined1 local_af8 [8];
  Value value;
  Expression expr;
  ReturnAction<ot::commissioner::Error> local_a70;
  Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> local_a60;
  WithoutMatchers local_a39;
  Matcher<const_ot::commissioner::ActiveOperationalDataset_&> local_a38;
  MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> local_a20;
  ReturnAction<bool> local_a00;
  Action<bool_()> local_9f0;
  ReturnAction<bool> local_9d0;
  Action<bool_()> local_9c0;
  WithoutMatchers local_999;
  MockSpec<bool_()> local_998;
  Error local_988;
  ReturnAction<ot::commissioner::Error> local_960;
  anon_class_8_1_f63482b3_for_action local_950;
  anon_class_8_1_f63482b3_for_action local_948;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:3142:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_940;
  undefined1 local_928 [40];
  Matcher<const_ot::commissioner::Config_&> local_900;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_8e8;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_8d0;
  undefined1 local_898 [8];
  CommissionerAppMockPtr commissionerAppMock;
  Message local_880;
  Status local_871;
  UnixTime local_870;
  allocator local_861;
  string local_860;
  allocator local_839;
  string local_838;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_818;
  allocator local_7f1;
  string local_7f0;
  Timestamp local_7d0;
  allocator local_7c1;
  string local_7c0;
  allocator local_799;
  string local_798;
  allocator local_771;
  string local_770;
  State local_750;
  allocator local_749;
  string local_748;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_728;
  allocator local_709;
  string local_708;
  BorderAgent local_6e8;
  Status local_569;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_3;
  Message local_550;
  Status local_541;
  UnixTime local_540;
  allocator local_531;
  string local_530;
  allocator local_509;
  string local_508;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_4e8;
  allocator local_4c1;
  string local_4c0;
  Timestamp local_4a0;
  allocator local_491;
  string local_490;
  allocator local_469;
  string local_468;
  allocator local_441;
  string local_440;
  State local_420;
  allocator local_419;
  string local_418;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_3f8;
  allocator local_3d9;
  string local_3d8;
  BorderAgent local_3b8;
  Status local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_2;
  Message local_220;
  _func_int **local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1f8;
  Message local_1f0;
  ErrorCode local_1e4;
  Error local_1e0;
  ErrorCode local_1b4;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  undefined1 local_198 [8];
  string mepdsFileName;
  undefined1 local_170 [8];
  string multiEntryPendingDataset;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_170,
             "\n{\n    \"DelayTimer\": 60000, // in milliseconds\n    \"PendingTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ActiveTimestamp\": {\n        \"Seconds\": 58, // 48 bits\n        \"Ticks\": 48, // 15 bits\n        \"U\": 0 // 1 bit\n    },\n    \"ExtendedPanId\": \"1122334455667788\",\n    \"NetworkName\": \"net1\",\n    \"SecurityPolicy\": {\n        \"Flags\": \"ff\",\n        \"RotationTime\": 673\n    }\n}"
             ,(allocator *)(mepdsFileName.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(mepdsFileName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_198,"./mepds.json",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  ot::commissioner::WriteFile(&local_1e0,(string *)local_170,(string *)local_198);
  local_1b4 = ot::commissioner::Error::GetCode(&local_1e0);
  local_1e4 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_1b0,"WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode()",
             "ErrorCode::kNone",&local_1b4,&local_1e4);
  ot::commissioner::Error::~Error(&local_1e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0xc37,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_218 = (_func_int **)0x0;
    testing::internal::
    CmpHelperNE<ot::commissioner::persistent_storage::Registry*,decltype(nullptr)>
              ((internal *)local_210,"ctx.mRegistry","nullptr",
               (Registry **)(ctx.mInterpreter.mCancelPipe + 1),&local_218);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar2) {
      testing::Message::Message(&local_220);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                 ,0xc39,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_220);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_220);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    this_00 = ctx.mInterpreter._192_8_;
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3d8,"127.0.0.1",&local_3d9);
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_3f8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_3f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,"1.1",&local_419);
      ot::commissioner::BorderAgent::State::State(&local_420,0,0,0,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_440,"net1",&local_441);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_468,"",&local_469);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_490,"",&local_491);
      local_4a0 = (Timestamp)0x0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c0,"",&local_4c1);
      local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4e8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_4e8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_508,"domain1",&local_509);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_530,"",&local_531);
      ot::commissioner::UnixTime::UnixTime(&local_540,0);
      ot::commissioner::BorderAgent::BorderAgent
                (&local_3b8,&local_3d8,0x4e21,&local_3f8,&local_418,local_420,&local_440,
                 0x1122334455667788,&local_468,&local_490,local_4a0,0,&local_4c0,&local_4e8,
                 &local_508,'\0',0,&local_530,local_540,0x101f);
      local_239 = ot::commissioner::persistent_storage::Registry::Add
                            ((Registry *)this_00,&local_3b8);
      local_541 = kSuccess;
      testing::internal::EqHelper::
      Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                ((EqHelper *)local_238,
                 "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 0x1122334455667788ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                 ,"RegistryStatus::kSuccess",&local_239,&local_541);
      ot::commissioner::BorderAgent::~BorderAgent(&local_3b8);
      std::__cxx11::string::~string((string *)&local_530);
      std::allocator<char>::~allocator((allocator<char> *)&local_531);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator((allocator<char> *)&local_509);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_4e8);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
      std::__cxx11::string::~string((string *)&local_490);
      std::allocator<char>::~allocator((allocator<char> *)&local_491);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator((allocator<char> *)&local_469);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)&local_441);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_3f8);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
      if (!bVar2) {
        testing::Message::Message(&local_550);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0xc3d,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_550);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_550);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_708,"127.0.0.2",&local_709);
        local_728.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_728.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_728.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_728);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_748,"1.1",&local_749);
        ot::commissioner::BorderAgent::State::State(&local_750,0,0,0,0,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_770,"net2",&local_771);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_798,"",&local_799);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7c0,"",&local_7c1);
        local_7d0 = (Timestamp)0x0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_7f0,"",&local_7f1);
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_818.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_818);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_838,"domain2",&local_839);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_860,"",&local_861);
        ot::commissioner::UnixTime::UnixTime(&local_870,0);
        pcVar3 = (char *)(ulong)(uint)local_750;
        ot::commissioner::BorderAgent::BorderAgent
                  (&local_6e8,&local_708,0x4e22,&local_728,&local_748,local_750,&local_770,
                   0x99aabbccddeeff00,&local_798,&local_7c0,local_7d0,0,&local_7f0,&local_818,
                   &local_838,'\0',0,&local_860,local_870,0x101f);
        local_569 = ot::commissioner::persistent_storage::Registry::Add
                              ((Registry *)ctx.mInterpreter._192_8_,&local_6e8);
        local_871 = kSuccess;
        testing::internal::EqHelper::
        Compare<ot::commissioner::persistent_storage::Registry::Status,_ot::commissioner::persistent_storage::Registry::Status,_nullptr>
                  ((EqHelper *)local_568,
                   "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 0x99AABBCCDDEEFF00ul, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit})"
                   ,"RegistryStatus::kSuccess",&local_569,&local_871);
        ot::commissioner::BorderAgent::~BorderAgent(&local_6e8);
        std::__cxx11::string::~string((string *)&local_860);
        std::allocator<char>::~allocator((allocator<char> *)&local_861);
        std::__cxx11::string::~string((string *)&local_838);
        std::allocator<char>::~allocator((allocator<char> *)&local_839);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_818);
        std::__cxx11::string::~string((string *)&local_7f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7f1);
        std::__cxx11::string::~string((string *)&local_7c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_7c1);
        std::__cxx11::string::~string((string *)&local_798);
        std::allocator<char>::~allocator((allocator<char> *)&local_799);
        std::__cxx11::string::~string((string *)&local_770);
        std::allocator<char>::~allocator((allocator<char> *)&local_771);
        std::__cxx11::string::~string((string *)&local_748);
        std::allocator<char>::~allocator((allocator<char> *)&local_749);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_728);
        std::__cxx11::string::~string((string *)&local_708);
        std::allocator<char>::~allocator((allocator<char> *)&local_709);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
        if (!bVar2) {
          testing::Message::Message(&local_880);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)
                     &commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                     ,0xc41,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)
                     &commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_880);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)
                     &commissionerAppMock.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          testing::Message::~Message(&local_880);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          pCVar5 = (CommissionerAppMock *)operator_new(0x1838);
          memset(pCVar5,0,0x1838);
          CommissionerAppMock::CommissionerAppMock(pCVar5);
          std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                    ((shared_ptr<CommissionerAppMock> *)local_898,pCVar5);
          testing::internal::AnythingMatcher::operator_cast_to_Matcher
                    (&local_8e8,(AnythingMatcher *)&testing::_);
          testing::internal::AnythingMatcher::operator_cast_to_Matcher
                    (&local_900,(AnythingMatcher *)&testing::_);
          CommissionerAppStaticExpecter::gmock_Create
                    (&local_8d0,
                     (CommissionerAppStaticExpecter *)
                     &ctx.mDefaultCommissionerObject.
                      super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,&local_8e8,&local_900);
          testing::internal::GetWithoutMatchers();
          this_01 = testing::internal::
                    MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    ::operator()(&local_8d0,(WithoutMatchers *)(local_928 + 0x27),(void *)0x0);
          pcVar4 = "ctx.mCommissionerAppStaticExpecter";
          this_02 = testing::internal::
                    MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                    ::InternalExpectedAt
                              (this_01,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xc44,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
          local_950.commissionerAppMock = (CommissionerAppMockPtr *)local_898;
          local_948.commissionerAppMock =
               (CommissionerAppMockPtr *)
               testing::
               WithArg<0ul,InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test::TestBody()::__0>
                         (&local_950);
          ot::commissioner::Error::Error(&local_988);
          testing::Return<ot::commissioner::Error>((testing *)&local_960,&local_988);
          testing::
          DoAll<testing::internal::WithArgsAction<InterpreterTestSuite_MNI_SingleEntryImportExplicitNetworkPass_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                    (&local_940,(testing *)&local_948,
                     (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:3142:30),_0UL>
                      *)&local_960,(ReturnAction<ot::commissioner::Error> *)pcVar4);
          testing::internal::DoAllAction::operator_cast_to_Action
                    ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                      *)local_928,(DoAllAction *)&local_940);
          pCVar5 = (CommissionerAppMock *)local_928;
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          ::WillOnce(this_02,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                              *)pCVar5);
          testing::
          Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          ::~Action((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                     *)local_928);
          testing::internal::
          DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:3142:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
          ::~DoAllAction(&local_940);
          testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_960);
          ot::commissioner::Error::~Error(&local_988);
          testing::internal::
          MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
          ::~MockSpec(&local_8d0);
          testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_900);
          testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher
                    (&local_8e8);
          peVar6 = std::
                   __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_898);
          local_998.function_mocker_ =
               (FunctionMocker<bool_()> *)
               CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar6,pCVar5);
          testing::internal::GetWithoutMatchers();
          this_03 = testing::internal::MockSpec<bool_()>::operator()
                              (&local_998,&local_999,(void *)0x0);
          pTVar7 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                             (this_03,
                              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                              ,0xc47,"*commissionerAppMock","IsActive()");
          testing::Return<bool>((testing *)&local_9d0,false);
          testing::internal::ReturnAction::operator_cast_to_Action
                    (&local_9c0,(ReturnAction *)&local_9d0);
          pTVar7 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar7,&local_9c0);
          testing::Return<bool>((testing *)&local_a00,true);
          testing::internal::ReturnAction::operator_cast_to_Action
                    (&local_9f0,(ReturnAction *)&local_a00);
          testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar7,&local_9f0);
          testing::Action<bool_()>::~Action(&local_9f0);
          testing::internal::ReturnAction<bool>::~ReturnAction(&local_a00);
          testing::Action<bool_()>::~Action(&local_9c0);
          testing::internal::ReturnAction<bool>::~ReturnAction(&local_9d0);
          peVar6 = std::
                   __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_898);
          testing::internal::AnythingMatcher::operator_cast_to_Matcher
                    (&local_a38,(AnythingMatcher *)&testing::_);
          CommissionerAppMock::gmock_SetActiveDataset(&local_a20,peVar6,&local_a38);
          testing::internal::GetWithoutMatchers();
          this_04 = testing::internal::
                    MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                    ::operator()(&local_a20,&local_a39,(void *)0x0);
          this_05 = testing::internal::
                    MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
                    ::InternalExpectedAt
                              (this_04,
                               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                               ,0xc48,"*commissionerAppMock","SetActiveDataset(_)");
          ot::commissioner::Error::Error
                    ((Error *)&expr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Return<ot::commissioner::Error>
                    ((testing *)&local_a70,
                     (Error *)&expr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::ReturnAction::operator_cast_to_Action
                    (&local_a60,(ReturnAction *)&local_a70);
          testing::internal::
          TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
          ::WillOnce(this_05,&local_a60);
          testing::
          Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::
          ~Action(&local_a60);
          testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_a70);
          ot::commissioner::Error::~Error
                    ((Error *)&expr.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::internal::
          MockSpec<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::
          ~MockSpec(&local_a20);
          testing::Matcher<const_ot::commissioner::ActiveOperationalDataset_&>::~Matcher(&local_a38)
          ;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value.mData.field_2 + 8));
          ot::commissioner::Interpreter::Value::Value((Value *)local_af8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_b30,"start --nwk net1",
                     (allocator *)
                     ((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          ot::commissioner::Interpreter::ParseExpression
                    (&local_b10,(Interpreter *)local_140,&local_b30);
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value.mData.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(pvVar1,&local_b10);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_b10);
          std::__cxx11::string::~string((string *)&local_b30);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&gtest_ar_.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     + 7));
          ot::commissioner::Interpreter::Eval(&local_b98,(Interpreter *)local_140,pvVar1);
          local_b49 = ot::commissioner::Interpreter::Value::HasNoError(&local_b98);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_b48,&local_b49,(type *)0x0);
          ot::commissioner::Interpreter::Value::~Value(&local_b98);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b48);
          if (!bVar2) {
            testing::Message::Message(&local_ba0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_bc8,(internal *)local_b48,
                       (AssertionResult *)"ctx.mInterpreter.Eval(expr).HasNoError()","false","true",
                       pcVar3);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_ba8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc4d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_ba8,&local_ba0);
            testing::internal::AssertHelper::~AssertHelper(&local_ba8);
            std::__cxx11::string::~string((string *)&local_bc8);
            testing::Message::~Message(&local_ba0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_b48);
          ot::commissioner::Interpreter::MultiNetCommandContext::Cleanup
                    ((MultiNetCommandContext *)local_140);
          this_06 = std::
                    __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)((long)&ctx.mInterpreter.mContext.mCommandKeys.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data + 0x10));
          ot::commissioner::JobManager::CleanupJobs(this_06);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_c20,"opdataset set active --nwk net1 --import ",&local_c21);
          std::operator+(&local_c00,&local_c20,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198);
          ot::commissioner::Interpreter::ParseExpression
                    (&local_be0,(Interpreter *)local_140,&local_c00);
          pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&value.mData.field_2 + 8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(pvVar1,&local_be0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_be0);
          std::__cxx11::string::~string((string *)&local_c00);
          std::__cxx11::string::~string((string *)&local_c20);
          std::allocator<char>::~allocator((allocator<char> *)&local_c21);
          ot::commissioner::Interpreter::Eval
                    ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
          ot::commissioner::Interpreter::Value::operator=
                    ((Value *)local_af8,(Value *)&gtest_ar__1.message_);
          ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
          local_c81 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_af8);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_c80,&local_c81,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c80);
          if (!bVar2) {
            testing::Message::Message(&local_c90);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_cb8,(internal *)local_c80,(AssertionResult *)0x46a487,"false","true",
                       pcVar3);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_c98,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                       ,0xc53,pcVar3);
            testing::internal::AssertHelper::operator=(&local_c98,&local_c90);
            testing::internal::AssertHelper::~AssertHelper(&local_c98);
            std::__cxx11::string::~string((string *)&local_cb8);
            testing::Message::~Message(&local_c90);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_c80);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          unlink(pcVar3);
          ot::commissioner::Interpreter::Value::~Value((Value *)local_af8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&value.mData.field_2 + 8));
          std::shared_ptr<CommissionerAppMock>::~shared_ptr
                    ((shared_ptr<CommissionerAppMock> *)local_898);
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ = 0;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_170);
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNI_SingleEntryImportExplicitNetworkPass)
{
    TestContext ctx;
    InitContext(ctx);

    const std::string multiEntryPendingDataset = "\n\
{\n\
    \"DelayTimer\": 60000, // in milliseconds\n\
    \"PendingTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 58, // 48 bits\n\
        \"Ticks\": 48, // 15 bits\n\
        \"U\": 0 // 1 bit\n\
    },\n\
    \"ExtendedPanId\": \"1122334455667788\",\n\
    \"NetworkName\": \"net1\",\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"ff\",\n\
        \"RotationTime\": 673\n\
    }\n\
}";
    const std::string mepdsFileName            = "./mepds.json";
    ASSERT_EQ(WriteFile(multiEntryPendingDataset, mepdsFileName).GetCode(), ErrorCode::kNone);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 0x1122334455667788ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain1", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 0x99AABBCCDDEEFF00ul, "", "", Timestamp{0, 0, 0}, 0, "",
                                             ByteArray{}, "domain2", 0, 0, "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, IsActive()).WillOnce(Return(false)).WillOnce(Return(true));
    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr = ctx.mInterpreter.ParseExpression("start --nwk net1");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    expr  = ctx.mInterpreter.ParseExpression(std::string("opdataset set active --nwk net1 --import ") + mepdsFileName);
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    unlink(mepdsFileName.c_str());
}